

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O0

Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>
* __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>
::operator+=(Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>
             *this,set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_>_>
                   *column)

{
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_>_>
  *column_local;
  Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>
  *this_local;
  
  _add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>>>>
            (this,column);
  return (Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>
          *)this;
}

Assistant:

inline Naive_vector_column<Master_matrix,Support>& Naive_vector_column<Master_matrix,Support>::operator+=(const Entry_range& column)
{
  static_assert((!Master_matrix::isNonBasic || std::is_same_v<Entry_range, Naive_vector_column>),
                "For boundary columns, the range has to be a column of same type to help ensure the validity of the "
                "base element.");  // could be removed, if we give the responsibility to the user.
  static_assert((!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type),
                "For chain columns, the given column cannot be constant.");

  _add(column);

  return *this;
}